

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcSetModuleFunctionAttribute(char *module,char *name,int index,uint attribute,uint value)

{
  ExternFuncInfo *pEVar1;
  
  pEVar1 = nullcFindModuleFunction(module,name,index);
  if (pEVar1 != (ExternFuncInfo *)0x0) {
    if (attribute == 0) {
      pEVar1->attributes = (uint)(value != 0) | pEVar1->attributes & 0xfffffffeU;
      return '\x01';
    }
    NULLC::nullcLastError = "ERROR: unknown function attribute";
  }
  return '\0';
}

Assistant:

nullres nullcSetModuleFunctionAttribute(const char* module, const char* name, int index, unsigned attribute, unsigned value)
{
	using namespace NULLC;

	if(ExternFuncInfo *fInfo = nullcFindModuleFunction(module, name, index))
	{
		unsigned attributeBit = 1 << attribute;

		switch(attribute)
		{
		case NULLC_ATTRIBUTE_NO_MEMORY_WRITE:
			fInfo->attributes = (fInfo->attributes & ~attributeBit) | (value != 0 ? attributeBit : 0);
			break;
		default:
			nullcLastError = "ERROR: unknown function attribute";
			return false;
		}

		return true;
	}

	return false;
}